

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
duckdb::DBConfig::GetOptionNames_abi_cxx11_(void)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RDI;
  long lVar4;
  long lVar5;
  idx_t count;
  long lVar6;
  optional_ptr<const_duckdb::ConfigurationOption,_true> local_38;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  plVar2 = (long *)(internal_options + 0x40);
  lVar6 = 0;
  do {
    lVar6 = lVar6 + 1;
    lVar4 = *plVar2;
    plVar2 = plVar2 + 8;
  } while (lVar4 != 0);
  if (lVar6 != 0) {
    lVar4 = 1;
    lVar5 = 0;
    do {
      plVar2 = (long *)(internal_options + 0x40);
      lVar3 = lVar4;
      do {
        lVar3 = lVar3 + -1;
        if (lVar3 == 0) {
          local_38.ptr = (ConfigurationOption *)(internal_options + lVar5 * 0x40);
          goto LAB_004d1299;
        }
        lVar1 = *plVar2;
        plVar2 = plVar2 + 8;
      } while (lVar1 != 0);
      local_38.ptr = (ConfigurationOption *)0x0;
LAB_004d1299:
      optional_ptr<const_duckdb::ConfigurationOption,_true>::CheckValid(&local_38);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*const&>(in_RDI,&(local_38.ptr)->name);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 1;
    } while (lVar6 != lVar5);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)in_RDI;
}

Assistant:

vector<std::string> DBConfig::GetOptionNames() {
	vector<string> names;
	for (idx_t i = 0, option_count = DBConfig::GetOptionCount(); i < option_count; i++) {
		names.emplace_back(DBConfig::GetOptionByIndex(i)->name);
	}
	return names;
}